

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::QuantileListOperation<duckdb::hugeint_t,false>>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  AggregateUnaryInput local_58;
  ulong local_40;
  ulong local_38;
  
  local_58.input = aggr_input_data;
  local_58.input_mask = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (local_58.input_idx = 0; local_58.input_idx < count;
        local_58.input_idx = local_58.input_idx + 1) {
      QuantileOperation::
      Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,false>>
                (states[local_58.input_idx],idata + local_58.input_idx,&local_58);
    }
  }
  else {
    local_58.input_idx = 0;
    local_40 = count + 0x3f >> 6;
    uVar8 = 0;
    uVar7 = 0;
    for (local_38 = 0; local_38 != local_40; local_38 = local_38 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
LAB_01bfcb0c:
        while (uVar6 = uVar7, uVar3 = uVar8, iVar4 = local_58.input_idx, uVar8 < uVar5) {
          QuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,false>>
                    (states[uVar8],idata + uVar8,&local_58);
          uVar8 = local_58.input_idx + 1;
          uVar7 = uVar8;
          local_58.input_idx = uVar8;
        }
      }
      else {
        uVar2 = puVar1[local_38];
        uVar5 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar5 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01bfcb0c;
        uVar6 = uVar5;
        uVar3 = uVar5;
        iVar4 = uVar5;
        if (uVar2 != 0) {
          while (uVar6 = uVar7, uVar3 = uVar7, iVar4 = local_58.input_idx, uVar7 < uVar5) {
            if ((uVar2 >> ((ulong)(uint)((int)uVar7 - (int)uVar8) & 0x3f) & 1) != 0) {
              QuantileOperation::
              Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::hugeint_t,false>>
                        (states[uVar7],idata + uVar7,&local_58);
              uVar7 = local_58.input_idx;
            }
            uVar7 = uVar7 + 1;
            local_58.input_idx = uVar7;
          }
        }
      }
      local_58.input_idx = iVar4;
      uVar8 = uVar3;
      uVar7 = uVar6;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}